

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsFreewheel.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsFreewheel::ChShaftsFreewheel(ChShaftsFreewheel *this,ChShaftsFreewheel *other)

{
  double dVar1;
  
  ChShaftsCouple::ChShaftsCouple(&this->super_ChShaftsCouple,&other->super_ChShaftsCouple);
  (this->super_ChShaftsCouple).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChShaftsFreewheel_01170eb8;
  this->violation = 0.0;
  ChConstraintTwoGenericBoxed::ChConstraintTwoGenericBoxed(&this->constraint);
  this->step = other->step;
  this->jamming_mode = other->jamming_mode;
  this->phase = other->phase;
  dVar1 = other->torque_react;
  this->alpha_max = other->alpha_max;
  this->torque_react = dVar1;
  this->free_forward = other->free_forward;
  return;
}

Assistant:

ChShaftsFreewheel::ChShaftsFreewheel(const ChShaftsFreewheel& other) : ChShaftsCouple(other), violation(0) {
    step = other.step;
    torque_react = other.torque_react;
    jamming_mode = other.jamming_mode;
    phase = other.phase;
    alpha_max = other.alpha_max;
    free_forward = other.free_forward;
}